

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O1

void __thiscall
CTestGen9Resource_Test2DStencilArrayedCpuBltResource_Test::TestBody
          (CTestGen9Resource_Test2DStencilArrayedCpuBltResource_Test *this)

{
  CTestGen9Resource_Test2DStencilArrayedCpuBltResource_Test *this_00;
  bool bVar1;
  int iVar2;
  GMM_RESOURCE_INFO *pGVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  ulong local_118;
  uint64_t SliceTileOffset;
  ulong local_108;
  ulong local_100;
  uint local_f8;
  uint local_f4;
  uint32_t SliceY;
  uint32_t Mip1RenderAlignedOffset;
  uint32_t Mip2RenderAlignedOffset;
  uint32_t Mip3RenderAlignedOffset;
  uint32_t Mip4RenderAlignedOffset;
  undefined4 local_d8;
  int iStack_d4;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  unsigned_long local_a8;
  uint auStack_a0 [11];
  uint local_74;
  GMM_RESOURCE_INFO *local_70;
  ulong local_68;
  CTestGen9Resource_Test2DStencilArrayedCpuBltResource_Test *local_60;
  byte local_51;
  AssertHelper local_50;
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  local_138 = 0;
  uStack_180 = 0;
  uStack_150 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_198 = 0x14500000002;
  uStack_130 = 0x100000000;
  uStack_190 = 0x20000000;
  local_188 = 0x400000000;
  local_158 = 0x600000000;
  local_168 = 4;
  uStack_160 = 4;
  pGVar3 = (GMM_RESOURCE_INFO *)
           (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                     (CommonULT::pGmmULTClientContext,&local_198);
  CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar3,8);
  local_70 = pGVar3;
  local_60 = this;
  CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar3,8);
  pGVar3 = local_70;
  uVar15 = (int)local_168 + 7U & 0xfffffff8;
  local_74 = (int)uStack_160 + 7;
  uVar13 = local_74 & 0xfffffff8;
  if ((uint)local_158 == 0) {
    _Mip4RenderAlignedOffset = 0;
    uVar14 = 0;
    uVar10 = 0;
    uVar11 = 0;
  }
  else {
    uVar9 = 2;
    if (2 < (uint)local_158 + 1) {
      uVar9 = (uint)local_158 + 1;
    }
    uVar5 = 1;
    uVar4 = 0;
    uVar14 = 0;
    _Mip4RenderAlignedOffset = 0;
    uVar7 = 0;
    do {
      uVar10 = uVar15 >> ((byte)uVar5 & 0x1f);
      uVar11 = uVar10 + 7 + (uint)(uVar10 == 0) & 0xfffffff8;
      uVar10 = uVar13 >> ((byte)uVar5 & 0x1f);
      uVar10 = uVar10 + 7 + (uint)(uVar10 == 0) & 0xfffffff8;
      if (uVar5 == 1) {
        uVar4 = (ulong)uVar11;
        _Mip4RenderAlignedOffset = uVar4;
      }
      else if (uVar5 == 2) {
        uVar4 = (ulong)((int)uVar4 + uVar11);
        uVar14 = uVar10;
        uVar10 = uVar7;
      }
      else {
        uVar14 = uVar14 + uVar10;
        uVar10 = uVar7;
      }
      uVar11 = (uint)uVar4;
      uVar5 = uVar5 + 1;
      uVar7 = uVar10;
    } while (uVar9 != uVar5);
  }
  if (uVar14 < uVar10) {
    uVar14 = uVar10;
  }
  uVar14 = uVar14 + uVar13;
  if (uVar15 < uVar11) {
    uVar15 = uVar11;
  }
  uVar10 = uVar15 + 0x3f & 0xffffffc0;
  CTestResource::VerifyResourcePitch<true>((CTestResource *)local_60,local_70,uVar10 * 2);
  CTestResource::VerifyResourcePitchInTiles<true>
            ((CTestResource *)local_60,pGVar3,uVar15 + 0x3f >> 6);
  this_00 = local_60;
  Mip3RenderAlignedOffset = uVar10 * uVar14;
  local_68 = (ulong)uVar10;
  CTestResource::VerifyResourceSize<true>
            ((CTestResource *)local_60,pGVar3,
             (ulong)(local_158._4_4_ * Mip3RenderAlignedOffset + 0xfff & 0xfffff000));
  SliceTileOffset = (ulong)uVar14;
  CTestResource::VerifyResourceQPitch<true>((CTestResource *)this_00,pGVar3,(ulong)uVar14);
  if ((local_158._4_4_ != 0) && (3 < (uint)local_158)) {
    iVar6 = (int)local_68;
    local_100 = (ulong)(iVar6 * uVar13);
    iVar2 = ((uVar13 >> 2) + 7 & 0xfffffff8) + uVar13;
    local_108 = (ulong)(uint)(iVar6 * iVar2 + (int)_Mip4RenderAlignedOffset);
    local_74 = (((local_74 >> 3) + 7 & 0xfffffff8) + iVar2) * iVar6 + (int)_Mip4RenderAlignedOffset;
    bVar8 = 1;
    local_60 = (CTestGen9Resource_Test2DStencilArrayedCpuBltResource_Test *)0x0;
    do {
      uStack_d0 = 0;
      auStack_a0[6] = 0;
      auStack_a0[7] = 0;
      auStack_a0[8] = 0;
      auStack_a0[9] = 0;
      auStack_a0[2] = 0;
      auStack_a0[3] = 0;
      auStack_a0[4] = 0;
      auStack_a0[5] = 0;
      local_a8 = 0;
      auStack_a0[0] = 0;
      auStack_a0[1] = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      iVar2 = (int)local_60;
      _local_d8 = CONCAT44(iVar2,1);
      (**(code **)(*(long *)local_70 + 0x68))(local_70,&local_d8);
      local_f8 = iVar2 * (int)SliceTileOffset;
      local_118 = (ulong)((local_f8 & 0xffffffc0) << 6);
      local_f8 = local_f8 & 0x3f;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (local_48,"SliceTileOffset","ReqInfo.Render.Offset64",&local_118,&local_a8);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar12 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar12 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x664,pcVar12);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","ReqInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_a0);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar12 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar12 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x665,pcVar12);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"SliceY","ReqInfo.Render.YOffset",&local_f8,auStack_a0 + 1);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar12 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar12 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x666,pcVar12);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      local_51 = bVar8;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar2 = (int)local_60 * Mip3RenderAlignedOffset;
      local_c8 = 0;
      uStack_c0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_a8 = 0;
      auStack_a0[0] = 0;
      auStack_a0[1] = 0;
      auStack_a0[2] = 0;
      auStack_a0[3] = 0;
      auStack_a0[4] = 0;
      auStack_a0[5] = 0;
      auStack_a0[6] = 0;
      auStack_a0[7] = 0;
      auStack_a0[8] = 0;
      auStack_a0[9] = 0;
      uStack_d0 = 1;
      _local_d8 = CONCAT44((int)local_60,1);
      (**(code **)(*(long *)local_70 + 0x68))(local_70,&local_d8);
      uVar15 = (int)local_100 + iVar2;
      uVar13 = uVar15 / (uint)local_68;
      uVar15 = uVar15 % (uint)local_68;
      gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","ReqInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_a0);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar12 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar12 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x671,pcVar12);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT44(gtest_ar.message_.ptr_._4_4_,uVar13) & 0xffffffff0000003f);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"Mip1Y % TileSize[1]","ReqInfo.Render.YOffset",(uint *)&gtest_ar.message_,
                 auStack_a0 + 1);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar12 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar12 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x672,pcVar12);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_f4 = uVar15 * 0x40 + (uVar13 & 0xffffffc0) * (uint)local_68;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_48,"Mip1RenderAlignedOffset","ReqInfo.Render.Offset64",&local_f4,&local_a8);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar12 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar12 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x676,pcVar12);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_c8 = 0;
      uStack_c0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_a8 = 0;
      auStack_a0[0] = 0;
      auStack_a0[1] = 0;
      auStack_a0[2] = 0;
      auStack_a0[3] = 0;
      auStack_a0[4] = 0;
      auStack_a0[5] = 0;
      auStack_a0[6] = 0;
      auStack_a0[7] = 0;
      auStack_a0[8] = 0;
      auStack_a0[9] = 0;
      uStack_d0 = 2;
      _local_d8 = CONCAT44((int)local_60,1);
      (**(code **)(*(long *)local_70 + 0x68))(local_70,&local_d8);
      uVar15 = (int)_Mip4RenderAlignedOffset + iVar2 + (int)local_100;
      uVar13 = uVar15 / (uint)local_68;
      uVar15 = uVar15 % (uint)local_68;
      gtest_ar.message_.ptr_._0_4_ = 8;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"8","ReqInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_a0);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar12 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar12 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x682,pcVar12);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT44(gtest_ar.message_.ptr_._4_4_,uVar13) & 0xffffffff0000003f);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"Mip2Y % TileSize[1]","ReqInfo.Render.YOffset",(uint *)&gtest_ar.message_,
                 auStack_a0 + 1);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar12 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar12 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x683,pcVar12);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      SliceY = (uVar15 & 0xffffffc0) * 0x40 + (uVar13 & 0xffffffc0) * (uint)local_68;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_48,"Mip2RenderAlignedOffset","ReqInfo.Render.Offset64",&SliceY,&local_a8);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar12 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar12 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x687,pcVar12);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_c8 = 0;
      uStack_c0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_a8 = 0;
      auStack_a0[0] = 0;
      auStack_a0[1] = 0;
      auStack_a0[2] = 0;
      auStack_a0[3] = 0;
      auStack_a0[4] = 0;
      auStack_a0[5] = 0;
      auStack_a0[6] = 0;
      auStack_a0[7] = 0;
      auStack_a0[8] = 0;
      auStack_a0[9] = 0;
      uStack_d0 = 3;
      _local_d8 = CONCAT44((int)local_60,1);
      (**(code **)(*(long *)local_70 + 0x68))(local_70,&local_d8);
      uVar15 = (int)local_108 + iVar2;
      uVar13 = uVar15 / (uint)local_68;
      uVar15 = uVar15 % (uint)local_68;
      gtest_ar.message_.ptr_._0_4_ = 8;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"8","ReqInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_a0);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar12 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar12 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x693,pcVar12);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT44(gtest_ar.message_.ptr_._4_4_,uVar13) & 0xffffffff0000003f);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"Mip3Y % TileSize[1]","ReqInfo.Render.YOffset",(uint *)&gtest_ar.message_,
                 auStack_a0 + 1);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar12 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar12 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x694,pcVar12);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      Mip1RenderAlignedOffset =
           (uVar15 & 0xffffffc0) * 0x40 + (uVar13 & 0xffffffc0) * (uint)local_68;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_48,"Mip3RenderAlignedOffset","ReqInfo.Render.Offset64",
                 &Mip1RenderAlignedOffset,&local_a8);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar12 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar12 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x698,pcVar12);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_c8 = 0;
      uStack_c0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_a8 = 0;
      auStack_a0[0] = 0;
      auStack_a0[1] = 0;
      auStack_a0[2] = 0;
      auStack_a0[3] = 0;
      auStack_a0[4] = 0;
      auStack_a0[5] = 0;
      auStack_a0[6] = 0;
      auStack_a0[7] = 0;
      auStack_a0[8] = 0;
      auStack_a0[9] = 0;
      uStack_d0 = 4;
      _local_d8 = CONCAT44((int)local_60,1);
      (**(code **)(*(long *)local_70 + 0x68))(local_70,&local_d8);
      uVar15 = (iVar2 + local_74) / (uint)local_68;
      uVar13 = (iVar2 + local_74) % (uint)local_68;
      gtest_ar.message_.ptr_._0_4_ = 8;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"8","ReqInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_a0);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar12 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar12 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x6a4,pcVar12);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT44(gtest_ar.message_.ptr_._4_4_,uVar15) & 0xffffffff0000003f);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"Mip4Y % TileSize[1]","ReqInfo.Render.YOffset",(uint *)&gtest_ar.message_,
                 auStack_a0 + 1);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar12 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar12 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x6a5,pcVar12);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      Mip2RenderAlignedOffset =
           (uVar13 & 0xffffffc0) * 0x40 + (uVar15 & 0xffffffc0) * (uint)local_68;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_48,"Mip4RenderAlignedOffset","ReqInfo.Render.Offset64",
                 &Mip2RenderAlignedOffset,&local_a8);
      bVar8 = local_51;
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar12 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar12 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x6a9,pcVar12);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_60 = (CTestGen9Resource_Test2DStencilArrayedCpuBltResource_Test *)(ulong)bVar8;
      if (local_158._4_4_ <= bVar8) break;
      bVar8 = bVar8 + 1;
    } while (3 < (uint)local_158);
  }
  (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
            (CommonULT::pGmmULTClientContext,local_70);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test2DStencilArrayedCpuBltResource)
{
    const uint32_t HAlign = {8};
    const uint32_t VAlign = {8};

    const uint32_t TileSize[2] = {64, 64}; //TileW

    GMM_RESCREATE_PARAMS gmmParams      = {};
    gmmParams.Type                      = RESOURCE_2D;
    gmmParams.NoGfxMemory               = 1;
    gmmParams.Flags.Info.TiledW         = 1;
    gmmParams.Flags.Gpu.SeparateStencil = 1;
    gmmParams.MaxLod                    = 0;
    gmmParams.ArraySize                 = 6;

    {
        uint32_t AlignedWidth  = 0;
        uint32_t AlignedHeight = 0;
        uint32_t ExpectedPitch = 0;
        // Valigned Mip Heights
        uint32_t Mip0Height = 0;
        uint32_t Mip1Height = 0;
        uint32_t Mip2Height = 0;

        // Haligned Mip Widths
        uint32_t Mip0Width = 0;
        uint32_t Mip1Width = 0;
        uint32_t Mip2Width = 0;

        TEST_BPP bpp          = TEST_BPP_8;
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x4;
        gmmParams.BaseHeight  = 0x4;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);

        // Mip resource Aligned Width calculation
        Mip0Width  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        Mip0Height = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);

        for(uint32_t i = 1; i <= gmmParams.MaxLod; i++)
        {
            uint32_t MipWidth  = GMM_ULT_ALIGN(GMM_ULT_MAX(Mip0Width >> i, 1), HAlign);
            uint32_t MipHeight = GMM_ULT_ALIGN(GMM_ULT_MAX(Mip0Height >> i, 1), VAlign);
            if(i == 1)
            {
                Mip1Width = AlignedWidth = MipWidth;
                Mip1Height               = MipHeight;
            }
            else if(i == 2)
            {
                AlignedWidth += MipWidth;
                Mip2Height = MipHeight;
            }
            else
            {
                Mip2Height += MipHeight;
            }
        }

        uint32_t MaxHeight = GMM_ULT_MAX(Mip1Height, Mip2Height);
        AlignedHeight      = Mip0Height + MaxHeight;

        ExpectedPitch = GMM_ULT_MAX(AlignedWidth, Mip0Width) * GetBppValue(bpp);
        ExpectedPitch = GMM_ULT_ALIGN(ExpectedPitch, TileSize[0]);
        //TileW is programmed as row-interleaved.. ie doubled pitch
        VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch * 2);

        VerifyResourcePitchInTiles<true>(ResourceInfo, static_cast<uint32_t>(ExpectedPitch / TileSize[0]));
        VerifyResourceSize<true>(ResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * AlignedHeight * gmmParams.ArraySize, PAGE_SIZE));
        VerifyResourceQPitch<true>(ResourceInfo, AlignedHeight);

        for(uint8_t i = 0; i < gmmParams.ArraySize && gmmParams.MaxLod >= 4; i++)
        {
            uint64_t ArrayOffset = AlignedHeight * ExpectedPitch * i;

            // Mip 0 offsets, offset is 0,0
            GMM_REQ_OFFSET_INFO ReqInfo = {0};
            ReqInfo.MipLevel            = 0;
            ReqInfo.ReqRender           = 1;
            ReqInfo.ArrayIndex          = i;
            ResourceInfo->GetOffset(ReqInfo);

            uint32_t Mip0Size        = ExpectedPitch * Mip0Height;
            uint64_t SliceTileOffset = GFX_ALIGN_FLOOR(AlignedHeight * i, TileSize[1]) * TileSize[0];
            uint32_t SliceY          = (AlignedHeight * i) % TileSize[1];
            EXPECT_EQ(SliceTileOffset, ReqInfo.Render.Offset64);
            EXPECT_EQ(0, ReqInfo.Render.XOffset);
            EXPECT_EQ(SliceY, ReqInfo.Render.YOffset);

            // Mip 1 offsets
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 1;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);
            uint32_t Mip1Offset = Mip0Size + ArrayOffset;
            uint32_t Mip1X      = uint32_t(Mip1Offset % ExpectedPitch);
            uint32_t Mip1Y      = uint32_t(Mip1Offset / ExpectedPitch);
            EXPECT_EQ(0, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip1Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip1X                            = GFX_ALIGN_FLOOR(Mip1X, TileSize[0]);
            Mip1Y                            = GFX_ALIGN_FLOOR(Mip1Y, TileSize[1]);
            uint32_t Mip1RenderAlignedOffset = Mip1Y * ExpectedPitch + (Mip1X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip1RenderAlignedOffset, ReqInfo.Render.Offset64);


            // Mip 2 offset
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 2;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);
            uint32_t Mip2Offset = Mip1Width * GetBppValue(bpp) + Mip0Height * ExpectedPitch + ArrayOffset;
            uint32_t Mip2X      = uint32_t(Mip2Offset % ExpectedPitch);
            uint32_t Mip2Y      = uint32_t(Mip2Offset / ExpectedPitch);
            EXPECT_EQ(8, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip2Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip2X                            = GFX_ALIGN_FLOOR(Mip2X, TileSize[0]);
            Mip2Y                            = GFX_ALIGN_FLOOR(Mip2Y, TileSize[1]);
            uint32_t Mip2RenderAlignedOffset = Mip2Y * ExpectedPitch + (Mip2X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip2RenderAlignedOffset, ReqInfo.Render.Offset64);

            // Mip 3 offset
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 3;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);

            uint32_t Mip3Offset = Mip1Width * GetBppValue(bpp) + (Mip0Height + GMM_ULT_ALIGN(Mip0Height >> 2, VAlign)) * ExpectedPitch + ArrayOffset;
            uint32_t Mip3X      = uint32_t(Mip3Offset % ExpectedPitch);
            uint32_t Mip3Y      = uint32_t(Mip3Offset / ExpectedPitch);
            EXPECT_EQ(8, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip3Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip3X                            = GFX_ALIGN_FLOOR(Mip3X, TileSize[0]);
            Mip3Y                            = GFX_ALIGN_FLOOR(Mip3Y, TileSize[1]);
            uint32_t Mip3RenderAlignedOffset = Mip3Y * ExpectedPitch + (Mip3X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip3RenderAlignedOffset, ReqInfo.Render.Offset64);

            // Mip 4 offset
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 4;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);
            uint32_t Mip4Offset = 0;
            Mip4Offset          = Mip1Width * GetBppValue(bpp) + (Mip0Height + GMM_ULT_ALIGN(Mip0Height >> 2, VAlign) + GMM_ULT_ALIGN(Mip0Height >> 3, VAlign)) * ExpectedPitch + ArrayOffset;
            uint32_t Mip4X      = uint32_t(Mip4Offset % ExpectedPitch);
            uint32_t Mip4Y      = uint32_t(Mip4Offset / ExpectedPitch);
            EXPECT_EQ(8, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip4Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip4X                            = GFX_ALIGN_FLOOR(Mip4X, TileSize[0]);
            Mip4Y                            = GFX_ALIGN_FLOOR(Mip4Y, TileSize[1]);
            uint32_t Mip4RenderAlignedOffset = Mip4Y * ExpectedPitch + (Mip4X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip4RenderAlignedOffset, ReqInfo.Render.Offset64);
        }

        //Verify CpuBlt path (uses Render offset for upload)
        {
#ifdef _WIN32
#define ULT_ALIGNED_MALLOC(Size, alignBytes) _aligned_malloc(Size, alignBytes)
#define ULT_ALIGNED_FREE(ptr) _aligned_free(ptr)
#else
#define ULT_ALIGNED_MALLOC(Size, alignBytes) memalign(alignBytes, Size)
#define ULT_ALIGNED_FREE(ptr) free(ptr)
#endif

#ifdef _WIN32
            void *LockVA = ULT_ALIGNED_MALLOC(ResourceInfo->GetSizeSurface(), ResourceInfo->GetBaseAlignment());
            memset(LockVA, 0, ResourceInfo->GetSizeSurface());
            void *Sysmem = malloc(gmmParams.BaseWidth64 * gmmParams.BaseHeight);
            memset(Sysmem, 0xbb, gmmParams.BaseWidth64 * gmmParams.BaseHeight);
            //Test Upload
            GMM_RES_COPY_BLT Blt  = {0};
            Blt.Gpu.pData         = LockVA;
            Blt.Gpu.Slice         = 4;
            Blt.Gpu.MipLevel      = 0;
            Blt.Sys.BufferSize    = gmmParams.BaseWidth64 * gmmParams.BaseHeight;
            Blt.Sys.pData         = Sysmem;
            Blt.Sys.RowPitch      = gmmParams.BaseWidth64;
            Blt.Sys.PixelPitch    = 1;
            Blt.Sys.SlicePitch    = Blt.Sys.BufferSize;
            Blt.Blt.Upload        = 1;
            Blt.Blt.BytesPerPixel = 1;
            ResourceInfo->CpuBlt(&Blt);

            uint64_t Offset = 0x100; /*Blt.Gpu.Slice * ResourceInfo->GetQPitchInBytes();*/ // Need SwizzledOffset
            for(uint8_t byte = 0; byte < Blt.Sys.BufferSize; byte++)
            {
                uint8_t *Byte = ((uint8_t *)LockVA) + Offset + byte;
                EXPECT_EQ(Byte[0], 0xbb);
            }

            free(Sysmem);
            ULT_ALIGNED_FREE(LockVA);
#endif
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}